

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O2

void __thiscall
ServerService::retransmit
          (ServerService *this,byte4 seqNo,int socketFD,sockaddr_storage clientDetails,
          SendUnit *sendUnit)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte *__buf;
  long lVar7;
  sockaddr_storage *psVar8;
  sockaddr *psVar9;
  byte bVar10;
  sockaddr local_90 [8];
  
  bVar10 = 0;
  __buf = SendUnit::getSendUnit(sendUnit,seqNo);
  psVar8 = &clientDetails;
  psVar9 = local_90;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    cVar1 = psVar8->__ss_padding[0];
    cVar2 = psVar8->__ss_padding[1];
    cVar3 = psVar8->__ss_padding[2];
    cVar4 = psVar8->__ss_padding[3];
    cVar5 = psVar8->__ss_padding[4];
    cVar6 = psVar8->__ss_padding[5];
    psVar9->sa_family = psVar8->ss_family;
    psVar9->sa_data[0] = cVar1;
    psVar9->sa_data[1] = cVar2;
    psVar9->sa_data[2] = cVar3;
    psVar9->sa_data[3] = cVar4;
    psVar9->sa_data[4] = cVar5;
    psVar9->sa_data[5] = cVar6;
    psVar8 = (sockaddr_storage *)((long)psVar8 + (ulong)bVar10 * -0x10 + 8);
    psVar9 = (sockaddr *)(psVar9[-(ulong)bVar10].sa_data + 6);
  }
  sendto(socketFD,__buf,0x5c0,0,local_90,0x80);
  free(__buf);
  return;
}

Assistant:

void ServerService::retransmit(byte4 seqNo, int socketFD, struct sockaddr_storage clientDetails, SendUnit *sendUnit) {
    byte *buffer = (byte *) calloc(MTU, sizeof(byte));
    memset(buffer, 0, MTU);
    buffer = sendUnit->getSendUnit(seqNo);
    sendResponse(socketFD, buffer, clientDetails);
    memset(buffer, 0, MTU);
    free(buffer);
}